

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O3

int AF_A_Explode(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  double dVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  PClass *pPVar6;
  PClassActor *pufftype;
  undefined4 extraout_var_00;
  int iVar7;
  PClassActor *pPVar8;
  AActor *pAVar9;
  char *pcVar10;
  int iVar11;
  int damage;
  AActor *pAVar12;
  uint uVar13;
  bool bVar14;
  int local_88;
  int local_80;
  FName local_6c;
  AActor *local_68;
  double local_60;
  VMReturn *local_58;
  double local_50;
  DAngle local_48;
  DAngle local_40;
  FName local_38;
  FName local_34;
  
  pPVar6 = AActor::RegistrationInfo.MyClass;
  local_58 = ret;
  if (numparam < 1) {
    pcVar10 = "(paramnum) < numparam";
    goto LAB_0066c887;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_0066c877;
  pAVar12 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar12 == (AActor *)0x0) goto LAB_0066c2a5;
    pPVar5 = (pAVar12->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(pAVar12->super_DThinker).super_DObject._vptr_DObject)(pAVar12);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
      (pAVar12->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar14 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar6 && bVar14) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar14 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar6) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar14) {
      pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0066c887;
    }
  }
  else {
    if (pAVar12 != (AActor *)0x0) goto LAB_0066c877;
LAB_0066c2a5:
    pAVar12 = (AActor *)0x0;
  }
  pPVar6 = AActor::RegistrationInfo.MyClass;
  local_68 = pAVar12;
  if (numparam == 1) {
LAB_0066c38c:
    uVar13 = 1;
    iVar4 = -1;
    local_80 = -1;
LAB_0066c3aa:
    local_88 = 0;
    bVar14 = false;
LAB_0066c3b2:
    damage = 10;
    iVar11 = 0;
LAB_0066c3b5:
    local_34.Index = 0x40;
    pPVar6 = PClass::FindClass(&local_34);
    pufftype = dyn_cast<PClassActor>((DObject *)pPVar6);
  }
  else {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_0066c877:
        pcVar10 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_0066c887;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar5 = (PClass *)puVar2[1];
          if (pPVar5 == (PClass *)0x0) {
            pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2);
            puVar2[1] = pPVar5;
          }
          bVar14 = pPVar5 != (PClass *)0x0;
          if (pPVar5 != pPVar6 && bVar14) {
            do {
              pPVar5 = pPVar5->ParentClass;
              bVar14 = pPVar5 != (PClass *)0x0;
              if (pPVar5 == pPVar6) break;
            } while (pPVar5 != (PClass *)0x0);
          }
          if (!bVar14) {
            pcVar10 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_0066c887;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_0066c877;
    }
    uVar13 = 1;
    if (numparam < 3) goto LAB_0066c38c;
    VVar1 = param[2].field_0.field_3.Type;
    if ((VVar1 != 0xff) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      pcVar10 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_0066c887:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x568,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if (numparam == 3) goto LAB_0066c38c;
    VVar1 = param[3].field_0.field_3.Type;
    if (VVar1 == '\0') {
      iVar4 = param[3].field_0.i;
    }
    else {
      iVar4 = -1;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x569,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if ((uint)numparam < 5) {
      local_80 = -1;
      goto LAB_0066c3aa;
    }
    VVar1 = param[4].field_0.field_3.Type;
    if (VVar1 == '\0') {
      local_80 = param[4].field_0.i;
    }
    else {
      local_80 = -1;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x56a,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if (numparam == 5) goto LAB_0066c3aa;
    VVar1 = param[5].field_0.field_3.Type;
    if (VVar1 == '\0') {
      uVar13 = param[5].field_0.i;
    }
    else if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x56b,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if ((uint)numparam < 7) goto LAB_0066c3aa;
    VVar1 = param[6].field_0.field_3.Type;
    if (VVar1 == '\0') {
      bVar14 = param[6].field_0.i != 0;
    }
    else {
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x56c,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      bVar14 = false;
    }
    if (numparam == 7) {
      local_88 = 0;
      goto LAB_0066c3b2;
    }
    VVar1 = param[7].field_0.field_3.Type;
    if (VVar1 == '\0') {
      local_88 = param[7].field_0.i;
    }
    else {
      local_88 = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x56d,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if ((uint)numparam < 9) goto LAB_0066c3b2;
    damage = 10;
    VVar1 = param[8].field_0.field_3.Type;
    if (VVar1 == '\0') {
      iVar11 = param[8].field_0.i;
    }
    else {
      iVar11 = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x56e,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if (numparam == 9) goto LAB_0066c3b5;
    VVar1 = param[9].field_0.field_3.Type;
    if (VVar1 == '\0') {
      damage = param[9].field_0.i;
    }
    else if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x56f,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if (((uint)numparam < 0xb) || (VVar1 = param[10].field_0.field_3.Type, VVar1 == 0xff))
    goto LAB_0066c3b5;
    if (VVar1 != '\x03') {
LAB_0066c905:
      pcVar10 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
LAB_0066c90c:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x570,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    pufftype = (PClassActor *)param[10].field_0.field_1.a;
    if (param[10].field_0.field_1.atag == 1) {
      if (pufftype == (PClassActor *)0x0) goto LAB_0066c86f;
      pPVar8 = pufftype;
      if (pufftype != (PClassActor *)AActor::RegistrationInfo.MyClass) {
        do {
          pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
          if (pPVar8 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
        } while (pPVar8 != (PClassActor *)0x0);
        if (pPVar8 == (PClassActor *)0x0) {
          pcVar10 = "pufftype == NULL || pufftype->IsDescendantOf(RUNTIME_CLASS(AActor))";
          goto LAB_0066c90c;
        }
      }
    }
    else {
      if (pufftype != (PClassActor *)0x0) goto LAB_0066c905;
LAB_0066c86f:
      pufftype = (PClassActor *)0x0;
    }
  }
  pAVar12 = local_68;
  iVar7 = 0;
  if (0xb < numparam) {
    VVar1 = param[0xb].field_0.field_3.Type;
    if (VVar1 == '\0') {
      iVar7 = param[0xb].field_0.i;
    }
    else {
      iVar7 = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x571,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
  }
  if (iVar4 < 0) {
    pPVar6 = (local_68->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar4 = (**(local_68->super_DThinker).super_DObject._vptr_DObject)(local_68);
      pPVar6 = (PClass *)CONCAT44(extraout_var_00,iVar4);
      (pAVar12->super_DThinker).super_DObject.Class = pPVar6;
    }
    local_80 = *(int *)((long)&pPVar6[1].FlatPointers + 4);
    iVar4 = *(int *)&pPVar6[1].Defaults;
    uVar13 = *(byte *)&pPVar6[1].FlatPointers ^ 1;
    bVar14 = false;
  }
  pAVar12 = local_68;
  if (local_80 < 1) {
    local_80 = iVar4;
  }
  if (0 < iVar11) {
    local_50 = (double)iVar11;
    dVar3 = 0.0;
    do {
      local_40.Degrees = (dVar3 * 360.0) / local_50;
      local_48.Degrees = 0.0;
      local_6c.Index = 200;
      local_60 = dVar3;
      P_LineAttack(pAVar12,&local_40,2048.0,&local_48,damage,&local_6c,pufftype,0,
                   (FTranslatedLineTarget *)0x0,(int *)0x0);
      dVar3 = local_60 + 1.0;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  if ((uVar13 & 8) == 0 && iVar7 == 0) {
    iVar7 = (pAVar12->DamageType).super_FName.Index;
  }
  pAVar9 = (pAVar12->target).field_0.p;
  if (pAVar9 != (AActor *)0x0) {
    if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0066c55a;
    (pAVar12->target).field_0.p = (AActor *)0x0;
  }
  pAVar9 = (AActor *)0x0;
LAB_0066c55a:
  local_38.Index = iVar7;
  iVar4 = P_RadiusAttack(pAVar12,pAVar9,iVar4,local_80,&local_38,uVar13 & 5,local_88);
  P_CheckSplash(pAVar12,(double)local_80);
  if ((bVar14) && (pAVar9 = (pAVar12->target).field_0.p, pAVar9 != (AActor *)0x0)) {
    if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if (pAVar9->player != (player_t *)0x0) {
        P_NoiseAlert(pAVar9,pAVar12,false,0.0);
      }
    }
    else {
      (pAVar12->target).field_0.p = (AActor *)0x0;
    }
  }
  if (numret < 1) {
    iVar4 = 0;
  }
  else {
    if (local_58 == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x59b,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if (local_58->RegType != '\0') {
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/vm.h"
                    ,0x118,"void VMReturn::SetInt(int)");
    }
    *(int *)local_58->Location = iVar4;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_Explode)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT_OPT	(damage)		   { damage = -1; }
	PARAM_INT_OPT	(distance)		   { distance = -1; }
	PARAM_INT_OPT	(flags)			   { flags = XF_HURTSOURCE; }
	PARAM_BOOL_OPT	(alert)			   { alert = false; }
	PARAM_INT_OPT	(fulldmgdistance)  { fulldmgdistance = 0; }
	PARAM_INT_OPT	(nails)			   { nails = 0; }
	PARAM_INT_OPT	(naildamage)	   { naildamage = 10; }
	PARAM_CLASS_OPT	(pufftype, AActor) { pufftype = PClass::FindActor(NAME_BulletPuff); }
	PARAM_NAME_OPT	(damagetype)		{ damagetype = NAME_None; }

	if (damage < 0)	// get parameters from metadata
	{
		damage = self->GetClass()->ExplosionDamage;
		distance = self->GetClass()->ExplosionRadius;
		flags = !self->GetClass()->DontHurtShooter;
		alert = false;
	}
	if (distance <= 0) distance = damage;

	// NailBomb effect, from SMMU but not from its source code: instead it was implemented and
	// generalized from the documentation at http://www.doomworld.com/eternity/engine/codeptrs.html

	if (nails)
	{
		DAngle ang;
		for (int i = 0; i < nails; i++)
		{
			ang = i*360./nails;
			// Comparing the results of a test wad with Eternity, it seems A_NailBomb does not aim
			P_LineAttack (self, ang, MISSILERANGE, 0.,
				//P_AimLineAttack (self, ang, MISSILERANGE), 
				naildamage, NAME_Hitscan, pufftype);
		}
	}

	if (!(flags & XF_NOACTORTYPE) && damagetype == NAME_None)
	{
		damagetype = self->DamageType;
	}

	int pflags = 0;
	if (flags & XF_HURTSOURCE)	pflags |= RADF_HURTSOURCE;
	if (flags & XF_NOTMISSILE)	pflags |= RADF_SOURCEISSPOT;

	int count = P_RadiusAttack (self, self->target, damage, distance, damagetype, pflags, fulldmgdistance);
	P_CheckSplash(self, distance);
	if (alert && self->target != NULL && self->target->player != NULL)
	{
		P_NoiseAlert(self->target, self);
	}
	ACTION_RETURN_INT(count);
}